

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O1

int lls_svd2(double *Ai,double *bi,int M,int N,double *xo)

{
  size_t __size;
  double *AB;
  double *q;
  double *B;
  double *A;
  double *pdVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  iVar3 = N;
  if (N < M) {
    iVar3 = M;
  }
  uVar7 = N + 1;
  uVar2 = 0;
  dVar9 = macheps();
  AB = (double *)malloc((long)iVar3 * (long)(int)uVar7 * 8);
  lVar4 = (long)N;
  __size = lVar4 * 8;
  q = (double *)malloc(__size);
  B = (double *)malloc(__size);
  A = (double *)malloc(__size * lVar4);
  uVar6 = (ulong)(uint)N;
  if (0 < M) {
    uVar5 = 0;
    uVar8 = (ulong)(uint)M;
    do {
      if (0 < N) {
        memcpy(AB + uVar2,Ai + uVar5,uVar6 * 8);
      }
      uVar5 = (ulong)(uint)((int)uVar5 + N);
      uVar2 = (ulong)((int)uVar2 + uVar7);
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  if (0 < M) {
    pdVar1 = AB + lVar4;
    uVar2 = 0;
    do {
      *pdVar1 = bi[uVar2];
      uVar2 = uVar2 + 1;
      pdVar1 = pdVar1 + (int)uVar7;
    } while ((uint)M != uVar2);
  }
  minfit(AB,M,N,1,q);
  if (0 < N) {
    uVar8 = 0;
    uVar5 = 0;
    uVar2 = uVar6;
    do {
      memcpy(A + uVar8,AB + uVar5,uVar6 * 8);
      uVar5 = (ulong)((int)uVar5 + uVar7);
      uVar8 = (ulong)(uint)((int)uVar8 + N);
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  if (0 < N) {
    uVar2 = 0;
    pdVar1 = A;
    do {
      uVar8 = 0;
      do {
        dVar10 = 0.0;
        if (dVar9 < ABS(q[uVar8])) {
          dVar10 = pdVar1[uVar8] / q[uVar8];
        }
        pdVar1[uVar8] = dVar10;
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
      uVar2 = uVar2 + 1;
      pdVar1 = pdVar1 + uVar6;
    } while (uVar2 != uVar6);
  }
  if (0 < N) {
    pdVar1 = AB + uVar6;
    uVar2 = 0;
    do {
      B[uVar2] = *pdVar1;
      uVar2 = uVar2 + 1;
      pdVar1 = pdVar1 + uVar7;
    } while (uVar6 != uVar2);
  }
  mmult(A,B,xo,N,N,1);
  free(AB);
  free(q);
  free(A);
  free(B);
  return 0;
}

Assistant:

int lls_svd2(double *Ai,double *bi,int M,int N,double *xo) {
	int retcode,P,mnmax,np,i,j,t,t2;
	double *AB,*q,*V,*C;
	double eps;

	if (M > N) {
		mnmax = M;
	} else {
		mnmax = N;
	}
	retcode = 0;
	P = 1;
	np = N + P;
	eps = macheps();

	AB = (double*) malloc(sizeof(double) * mnmax * np);
	q = (double*) malloc(sizeof(double) * N);
	C = (double*) malloc(sizeof(double) * N);
	V = (double*) malloc(sizeof(double) * N * N);

	for(i = 0; i < M;++i) {
		t = i * N;
		t2 = i * np;
		for(j = 0; j < N;++j) {
			AB[t2 + j] = Ai[t+j];
		}
	}

	for(i = 0; i < M;++i) {
		t2 = i * np;
		AB[t2+N] = bi[i];
	}

	minfit(AB,M,N,P,q);

	for(i = 0; i < N;++i) {
		t = i * N;
		t2 = i * np;
		for(j = 0; j < N;++j) {
			V[t+j] = AB[t2 + j];
		}
	}

	for(i = 0; i < N;++i) {
		t = i *N;
		for(j = 0; j < N;++j) {
			if (fabs(q[j]) > eps) {
				V[t+j] /= q[j];
			} else {
				V[t+j] = 0.0;
			}
		}
	}

	for(i = 0; i < N;++i) {
		t2 = i * np;
		C[i] = AB[t2+N];
	}
	mmult(V,C,xo,N,N,1);

	free(AB);
	free(q);
	free(V);
	free(C);
	return retcode;
}